

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_column_data_get.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalColumnDataGet::LogicalColumnDataGet
          (LogicalColumnDataGet *this,idx_t table_index,vector<duckdb::LogicalType,_true> *types,
          unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
          *collection_p)

{
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_CHUNK_GET);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalColumnDataGet_0247a798;
  this->table_index = table_index;
  (this->chunk_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->chunk_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chunk_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->collection).owned.
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> =
       (_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)
       (collection_p->
       super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
       .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl;
  (collection_p->
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       (ColumnDataCollection *)0x0;
  (this->collection).ptr.ptr =
       (ColumnDataCollection *)
       (this->collection).owned.
       super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
       .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
            (&(this->chunk_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,types);
  return;
}

Assistant:

LogicalColumnDataGet::LogicalColumnDataGet(idx_t table_index, vector<LogicalType> types,
                                           unique_ptr<ColumnDataCollection> collection_p)
    : LogicalOperator(LogicalOperatorType::LOGICAL_CHUNK_GET), table_index(table_index),
      collection(std::move(collection_p)) {
	D_ASSERT(types.size() > 0);
	chunk_types = std::move(types);
}